

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_mapper.cpp
# Opt level: O1

string * __thiscall
spvtools::FriendlyNameMapper::NameForEnumOperand_abi_cxx11_
          (string *__return_storage_ptr__,FriendlyNameMapper *this,spv_operand_type_t type,
          uint32_t word)

{
  size_type *psVar1;
  spv_result_t sVar2;
  undefined8 *puVar3;
  uint32_t n;
  ulong uVar4;
  undefined8 uVar5;
  spv_operand_desc desc;
  string local_70;
  spv_operand_desc local_50;
  ulong *local_48;
  long local_40;
  ulong local_38 [2];
  
  local_50 = (spv_operand_desc)0x0;
  sVar2 = AssemblyGrammar::lookupOperand(&this->grammar_,type,word,&local_50);
  if (sVar2 == SPV_SUCCESS) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,local_50->name,(allocator<char> *)&local_48);
    return __return_storage_ptr__;
  }
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"StorageClass","");
  to_string_abi_cxx11_(&local_70,(spvtools *)(ulong)word,n);
  uVar4 = 0xf;
  if (local_48 != local_38) {
    uVar4 = local_38[0];
  }
  if (uVar4 < local_70._M_string_length + local_40) {
    uVar5 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      uVar5 = local_70.field_2._M_allocated_capacity;
    }
    if (local_70._M_string_length + local_40 <= (ulong)uVar5) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_48);
      goto LAB_001c2544;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_48,(ulong)local_70._M_dataplus._M_p);
LAB_001c2544:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar3 + 2;
  if ((size_type *)*puVar3 == psVar1) {
    uVar5 = puVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar5;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar3[1];
  *puVar3 = psVar1;
  puVar3[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FriendlyNameMapper::NameForEnumOperand(spv_operand_type_t type,
                                                   uint32_t word) {
  spv_operand_desc desc = nullptr;
  if (SPV_SUCCESS == grammar_.lookupOperand(type, word, &desc)) {
    return desc->name;
  } else {
    // Invalid input.  Just give something.
    return std::string("StorageClass") + to_string(word);
  }
}